

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.hpp
# Opt level: O2

void __thiscall duckdb::ArrowRunEndEncodingState::Reset(ArrowRunEndEncodingState *this)

{
  ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
            ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)this,
             (pointer)0x0);
  ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
            ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&this->values,
             (pointer)0x0);
  return;
}

Assistant:

void Reset() {
		run_ends.reset();
		values.reset();
	}